

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmsrcf.cpp
# Opt level: O0

void __thiscall CVmSrcfTable::~CVmSrcfTable(CVmSrcfTable *this)

{
  long *in_RDI;
  CVmSrcfTable *unaff_retaddr;
  
  if (*in_RDI != 0) {
    clear(unaff_retaddr);
    free((void *)*in_RDI);
  }
  return;
}

Assistant:

CVmSrcfTable::~CVmSrcfTable()
{
    /* delete the list if we allocated one */
    if (list_ != 0)
    {
        /* clear the table */
        clear();

        /* delete the list */
        t3free(list_);
    }
}